

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConditionalExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConditionalExpression,slang::ast::Type_const&,std::span<slang::ast::ConditionalExpression::Condition,18446744073709551615ul>,slang::SourceLocation,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange,bool&,bool&>
          (BumpAllocator *this,Type *args,
          span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *args_1,
          SourceLocation *args_2,Expression *args_3,Expression *args_4,SourceRange *args_5,
          bool *args_6,bool *args_7)

{
  bool bVar1;
  bool bVar2;
  SourceLocation SVar3;
  pointer pCVar4;
  size_t sVar5;
  SourceLocation SVar6;
  SourceLocation SVar7;
  ConditionalExpression *pCVar8;
  
  pCVar8 = (ConditionalExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConditionalExpression *)this->endPtr < pCVar8 + 1) {
    pCVar8 = (ConditionalExpression *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pCVar8 + 1);
  }
  pCVar4 = args_1->_M_ptr;
  sVar5 = (args_1->_M_extent)._M_extent_value;
  SVar3 = *args_2;
  bVar1 = *args_6;
  bVar2 = *args_7;
  SVar6 = args_5->startLoc;
  SVar7 = args_5->endLoc;
  (pCVar8->super_Expression).kind = ConditionalOp;
  (pCVar8->super_Expression).type.ptr = args;
  (pCVar8->super_Expression).constant = (ConstantValue *)0x0;
  (pCVar8->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pCVar8->super_Expression).sourceRange.startLoc = SVar6;
  (pCVar8->super_Expression).sourceRange.endLoc = SVar7;
  (pCVar8->conditions)._M_ptr = pCVar4;
  (pCVar8->conditions)._M_extent._M_extent_value = sVar5;
  pCVar8->opLoc = SVar3;
  pCVar8->left_ = args_3;
  pCVar8->right_ = args_4;
  pCVar8->isConst = bVar1;
  pCVar8->isTrue = bVar2;
  return pCVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }